

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

char * classend(MatchState *ms,char *p)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  lua_State *L;
  
  pcVar3 = p + 1;
  if (*p == '[') {
    if (p[1] == '^') {
      pcVar3 = p + 2;
    }
    cVar2 = p[(ulong)(p[1] == '^') + 1];
    do {
      if (cVar2 == '\0') {
        L = ms->L;
        pcVar3 = "malformed pattern (missing \']\')";
        goto LAB_00110fba;
      }
      pcVar1 = pcVar3 + 1;
      if ((cVar2 == '%') && (pcVar3[1] != '\0')) {
        pcVar1 = pcVar3 + 2;
      }
      pcVar3 = pcVar1;
      cVar2 = *pcVar3;
    } while (cVar2 != ']');
    pcVar3 = pcVar3 + 1;
  }
  else if (*p == '%') {
    if (*pcVar3 == '\0') {
      L = ms->L;
      pcVar3 = "malformed pattern (ends with \'%%\')";
LAB_00110fba:
      luaL_error(L,pcVar3);
    }
    pcVar3 = p + 2;
  }
  return pcVar3;
}

Assistant:

static const char*classend(MatchState*ms,const char*p){
switch(*p++){
case'%':{
if(*p=='\0')
luaL_error(ms->L,"malformed pattern (ends with "LUA_QL("%%")")");
return p+1;
}
case'[':{
if(*p=='^')p++;
do{
if(*p=='\0')
luaL_error(ms->L,"malformed pattern (missing "LUA_QL("]")")");
if(*(p++)=='%'&&*p!='\0')
p++;
}while(*p!=']');
return p+1;
}
default:{
return p;
}
}
}